

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadSegs<mapseg_t>(MapData *map)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  FileReader *pFVar4;
  double *pdVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  vertex_t *pvVar8;
  vertex_t *pvVar9;
  seg_t *psVar10;
  void *__s;
  size_t __n;
  void *buffer;
  vertex_t **ppvVar11;
  long lVar12;
  undefined4 *puVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  line_t_conflict *plVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  TVector2<double> TVar24;
  DVector2 delta;
  DAngle seg_angle;
  DAngle ptp_angle;
  
  uVar19 = (ulong)numvertexes;
  __s = operator_new__(uVar19);
  pFVar4 = map->MapLumps[5].Reader;
  if (pFVar4 == (FileReader *)0x0) {
    uVar20 = 0;
  }
  else {
    uVar20 = (ulong)(int)pFVar4->Length;
  }
  uVar17 = 0;
  memset(__s,0,uVar19);
  numsegs = (int)(uVar20 / 0xc);
  if (numsegs == 0) {
    Printf("This map has no segs.\n");
    if (subsectors != (subsector_t *)0x0) {
      operator_delete__(subsectors);
    }
    if (nodes != (node_t *)0x0) {
      operator_delete__(nodes);
    }
    operator_delete__(__s);
    ForceNodeBuild = true;
  }
  else {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (long)numsegs;
    __n = SUB168(auVar7 * ZEXT816(0x30),0);
    uVar19 = 0xffffffffffffffff;
    if (SUB168(auVar7 * ZEXT816(0x30),8) == 0) {
      uVar19 = __n;
    }
    segs = (seg_t *)operator_new__(uVar19);
    memset(segs,0,__n);
    buffer = operator_new__(uVar20);
    MapData::Read(map,5,buffer,-1);
    uVar19 = (ulong)(uint)numsubsectors;
    if (numsubsectors < 1) {
      uVar19 = uVar17;
    }
    for (; pvVar8 = vertexes, uVar19 * 0x30 - uVar17 != 0; uVar17 = uVar17 + 0x30) {
      *(seg_t **)((long)&subsectors->firstline + uVar17) =
           segs + *(long *)((long)&subsectors->firstline + uVar17);
    }
    uVar19 = 0;
    if (0 < numlines) {
      uVar19 = (ulong)(uint)numlines;
    }
    ppvVar11 = &lines->v2;
    while (iVar15 = (int)uVar19, uVar19 = (ulong)(iVar15 - 1), iVar15 != 0) {
      *(undefined1 *)((long)__s + ((long)*ppvVar11 - (long)pvVar8 >> 4)) = 1;
      *(undefined1 *)
       ((long)__s + ((long)((line_t_conflict *)(ppvVar11 + -1))->v1 - (long)pvVar8 >> 4)) = 1;
      ppvVar11 = ppvVar11 + 0x13;
    }
    lVar21 = 0;
    for (lVar14 = 0; psVar10 = segs, pvVar8 = vertexes, lVar14 < numsegs; lVar14 = lVar14 + 1) {
      uVar1 = *(ushort *)((long)buffer + lVar21);
      uVar2 = *(ushort *)((long)buffer + lVar21 + 2);
      uVar20 = (ulong)uVar2;
      if ((numvertexes <= (int)(uint)uVar1) || (numvertexes <= (int)(uint)uVar2)) {
        puVar13 = (undefined4 *)__cxa_allocate_exception(0xc,&delta,uVar19);
        uVar16 = (uint)uVar2;
        if ((uint)uVar2 < (uint)uVar1) {
          uVar16 = (uint)uVar1;
        }
        *puVar13 = 0;
        puVar13[1] = (int)lVar14;
        puVar13[2] = uVar16;
        __cxa_throw(puVar13,&badseg::typeinfo,0);
      }
      *(vertex_t **)((long)&segs->v1 + lVar21 * 4) = vertexes + uVar1;
      pvVar9 = vertexes;
      *(vertex_t **)((long)&psVar10->v2 + lVar21 * 4) = vertexes + uVar2;
      uVar3 = *(ushort *)((long)buffer + lVar21 + 4);
      delta.X = pvVar9[uVar2].p.X - pvVar8[uVar1].p.X;
      delta.Y = pvVar9[uVar2].p.Y - pvVar8[uVar1].p.Y;
      TVector2<double>::Angle((TVector2<double> *)&ptp_angle);
      dVar23 = (ptp_angle.Degrees - (double)((ulong)uVar3 << 0x10) * 8.381903171539307e-08) *
               11930464.711111112 + 6755399441055744.0;
      dVar22 = ABS((double)SUB84(dVar23,0) * 8.381903171539307e-08);
      TVar24.Y = dVar23;
      TVar24.X = dVar22;
      if (1.0 <= dVar22) {
        pdVar5 = *(double **)((long)&psVar10->v1 + lVar21 * 4);
        pdVar6 = *(double **)((long)&psVar10->v2 + lVar21 * 4);
        delta.X = *pdVar6 - *pdVar5;
        delta.Y = pdVar6[1] - pdVar5[1];
        dVar22 = TVector2<double>::Length(&delta);
        TVar24 = TAngle<double>::ToVector((TAngle<double> *)&delta,dVar22);
        if ((uVar1 < uVar2) && (*(char *)((long)__s + uVar20) == '\0')) {
          pdVar5 = *(double **)((long)&psVar10->v1 + lVar21 * 4);
          pdVar6 = *(double **)((long)&psVar10->v2 + lVar21 * 4);
          dVar22 = pdVar5[1];
          dVar23 = *pdVar5 + delta.X;
          *pdVar6 = dVar23;
          pdVar6[1] = dVar22 + delta.Y;
        }
        else {
          if (*(char *)((long)__s + (ulong)uVar1) != '\0') goto LAB_0044bd31;
          pdVar5 = *(double **)((long)&psVar10->v1 + lVar21 * 4);
          pdVar6 = *(double **)((long)&psVar10->v2 + lVar21 * 4);
          dVar22 = pdVar6[1];
          dVar23 = *pdVar6 - delta.X;
          *pdVar5 = dVar23;
          pdVar5[1] = dVar22 - delta.Y;
          uVar20 = (ulong)uVar1;
        }
        TVar24.Y = TVar24.Y;
        TVar24.X = dVar23;
        *(undefined1 *)((long)__s + uVar20) = 1;
      }
LAB_0044bd31:
      uVar1 = *(ushort *)((long)buffer + lVar21 + 6);
      uVar16 = (uint)uVar1;
      if ((uint)numlines <= (uint)uVar1) {
        puVar13 = (undefined4 *)__cxa_allocate_exception(TVar24.X,TVar24.Y,0xc);
        *puVar13 = 1;
LAB_0044be7e:
        puVar13[1] = (int)lVar14;
        puVar13[2] = uVar16;
        __cxa_throw(puVar13,&badseg::typeinfo,0);
      }
      plVar18 = lines + uVar1;
      *(line_t_conflict **)((long)&psVar10->linedef + lVar21 * 4) = plVar18;
      uVar20 = (ulong)*(short *)((long)buffer + lVar21 + 8);
      lVar12 = (long)plVar18->sidedef[uVar20] - (long)sides;
      uVar19 = lVar12 % 0xc0;
      if ((uint)numsides <= (uint)(lVar12 / 0xc0)) {
        puVar13 = (undefined4 *)__cxa_allocate_exception(TVar24.X,TVar24.Y,0xc,&delta,uVar19);
        uVar16 = (uint)(((long)plVar18->sidedef[uVar20] - (long)sides) / 0xc0);
        *puVar13 = 2;
        goto LAB_0044be7e;
      }
      *(side_t **)((long)&psVar10->sidedef + lVar21 * 4) = plVar18->sidedef[uVar20];
      *(sector_t_conflict **)((long)&psVar10->frontsector + lVar21 * 4) =
           plVar18->sidedef[uVar20]->sector;
      uVar16 = plVar18->flags;
      if (((uVar16 & 4) == 0) || (plVar18->sidedef[uVar20 ^ 1] == (side_t *)0x0)) {
        *(undefined8 *)((long)&psVar10->backsector + lVar21 * 4) = 0;
        plVar18->flags = uVar16 & 0xfffffffb;
      }
      else {
        *(sector_t_conflict **)((long)&psVar10->backsector + lVar21 * 4) =
             plVar18->sidedef[uVar20 ^ 1]->sector;
      }
      lVar21 = lVar21 + 0xc;
    }
    operator_delete__(__s);
    operator_delete__(buffer);
  }
  return;
}

Assistant:

void P_LoadSegs (MapData * map)
{
	int  i;
	BYTE *data;
	BYTE *vertchanged = new BYTE[numvertexes];	// phares 10/4/98
	DWORD segangle;
	line_t* line;		// phares 10/4/98
	//int ptp_angle;		// phares 10/4/98
	//int delta_angle;	// phares 10/4/98
	int vnum1,vnum2;	// phares 10/4/98
	int lumplen = map->Size(ML_SEGS);

	memset (vertchanged,0,numvertexes); // phares 10/4/98

	numsegs = lumplen / sizeof(segtype);

	if (numsegs == 0)
	{
		Printf ("This map has no segs.\n");
		delete[] subsectors;
		delete[] nodes;
		delete[] vertchanged;
		ForceNodeBuild = true;
		return;
	}

	segs = new seg_t[numsegs];
	memset (segs, 0, numsegs*sizeof(seg_t));

	data = new BYTE[lumplen];
	map->Read(ML_SEGS, data);

	for (i = 0; i < numsubsectors; ++i)
	{
		subsectors[i].firstline = &segs[(size_t)subsectors[i].firstline];
	}

	// phares: 10/4/98: Vertchanged is an array that represents the vertices.
	// Mark those used by linedefs. A marked vertex is one that is not a
	// candidate for movement further down.

	line = lines;
	for (i = 0; i < numlines ; i++, line++)
	{
		vertchanged[line->v1 - vertexes] = vertchanged[line->v2 - vertexes] = 1;
	}

	try
	{
		for (i = 0; i < numsegs; i++)
		{
			seg_t *li = segs + i;
			segtype *ml = ((segtype *) data) + i;

			int side, linedef;
			line_t *ldef;

			vnum1 = ml->V1();
			vnum2 = ml->V2();

			if (vnum1 >= numvertexes || vnum2 >= numvertexes)
			{
				throw badseg(0, i, MAX(vnum1, vnum2));
			}

			li->v1 = &vertexes[vnum1];
			li->v2 = &vertexes[vnum2];

			segangle = (WORD)LittleShort(ml->angle);

			// phares 10/4/98: In the case of a lineseg that was created by splitting
			// another line, it appears that the line angle is inherited from the
			// father line. Due to roundoff, the new vertex may have been placed 'off
			// the line'. When you get close to such a line, and it is very short,
			// it's possible that the roundoff error causes 'firelines', the thin
			// lines that can draw from screen top to screen bottom occasionally. This
			// is due to all the angle calculations that are done based on the line
			// angle, the angles from the viewer to the vertices, and the viewer's
			// angle in the world. In the case of firelines, the rounded-off position
			// of one of the vertices determines one of these angles, and introduces
			// an error in the scaling factor for mapping textures and determining
			// where on the screen the ceiling and floor spans should be shown. For a
			// fireline, the engine thinks the ceiling bottom and floor top are at the
			// midpoint of the screen. So you get ceilings drawn all the way down to the
			// screen midpoint, and floors drawn all the way up. Thus 'firelines'. The
			// name comes from the original sighting, which involved a fire texture.
			//
			// To correct this, reset the vertex that was added so that it sits ON the
			// split line.
			//
			// To know which of the two vertices was added, its number is greater than
			// that of the last of the author-created vertices. If both vertices of the
			// line were added by splitting, pick the higher-numbered one. Once you've
			// changed a vertex, don't change it again if it shows up in another seg.
			//
			// To determine if there's an error in the first place, find the
			// angle of the line between the two seg vertices. If it's one degree or more
			// off, then move one vertex. This may seem insignificant, but one degree
			// errors _can_ cause firelines.

			DAngle ptp_angle = (li->v2->fPos() - li->v1->fPos()).Angle();
			DAngle seg_angle = AngleToFloat(segangle << 16);
			DAngle delta_angle = absangle(ptp_angle, seg_angle);

			if (delta_angle >= 1.)
			{
				double dis = (li->v2->fPos() - li->v1->fPos()).Length();
				DVector2 delta = seg_angle.ToVector(dis);
				if ((vnum2 > vnum1) && (vertchanged[vnum2] == 0))
				{
					li->v2->set(li->v1->fPos() + delta);
					vertchanged[vnum2] = 1; // this was changed
				}
				else if (vertchanged[vnum1] == 0)
				{
					li->v1->set(li->v2->fPos() - delta);
					vertchanged[vnum1] = 1; // this was changed
				}
			}

			linedef = LittleShort(ml->linedef);
			if ((unsigned)linedef >= (unsigned)numlines)
			{
				throw badseg(1, i, linedef);
			}
			ldef = &lines[linedef];
			li->linedef = ldef;
			side = LittleShort(ml->side);
			if ((unsigned)(ldef->sidedef[side] - sides) >= (unsigned)numsides)
			{
				throw badseg(2, i, int(ldef->sidedef[side] - sides));
			}
			li->sidedef = ldef->sidedef[side];
			li->frontsector = ldef->sidedef[side]->sector;

			// killough 5/3/98: ignore 2s flag if second sidedef missing:
			if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
			{
				li->backsector = ldef->sidedef[side^1]->sector;
			}
			else
			{
				li->backsector = 0;
				ldef->flags &= ~ML_TWOSIDED;
			}
		}
	}
	catch (const badseg &bad) // the preferred way is to catch by (const) reference.
	{
		switch (bad.badtype)
		{
		case 0:
			Printf ("Seg %d references a nonexistant vertex %d (max %d).\n", bad.badsegnum, bad.baddata, numvertexes);
			break;

		case 1:
			Printf ("Seg %d references a nonexistant linedef %d (max %d).\n", bad.badsegnum, bad.baddata, numlines);
			break;

		case 2:
			Printf ("The linedef for seg %d references a nonexistant sidedef %d (max %d).\n", bad.badsegnum, bad.baddata, numsides);
			break;
		}
		Printf ("The BSP will be rebuilt.\n");
		delete[] segs;
		delete[] subsectors;
		delete[] nodes;
		ForceNodeBuild = true;
	}

	delete[] vertchanged; // phares 10/4/98
	delete[] data;
}